

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::BackgroundReleasePagesSweep
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,Recycler *recycler)

{
  char *address;
  IdleDecommitPageAllocator *this_00;
  
  HeapBlockMap64::ClearHeapBlock
            (&recycler->heapBlockMap,(this->super_HeapBlock).address,
             8 - (ulong)(0x8000U % (uint)this->objectSize >> 0xc));
  address = (this->super_HeapBlock).address;
  if (0xfff < 0x8000U % (uint)this->objectSize) {
    RestoreUnusablePages(this);
  }
  this_00 = GetPageAllocator(this);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::BackgroundReleasePages
            (&this_00->super_PageAllocator,address,8,
             (PageSegmentBase<Memory::VirtualAllocWrapper> *)(this->super_HeapBlock).segment);
  (this->super_HeapBlock).address = (char *)0x0;
  (this->super_HeapBlock).segment = (Segment *)0x0;
  Reset(this);
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::BackgroundReleasePagesSweep(Recycler* recycler)
{
    recycler->heapBlockMap.ClearHeapBlock(address, this->GetPageCount() - this->GetUnusablePageCount());
    char* address = this->address;

    if (this->GetUnusablePageCount() > 0)
    {
        this->RestoreUnusablePages();
    }
    this->GetPageAllocator()->BackgroundReleasePages(address, this->GetPageCount(), this->GetPageSegment());

    this->address = nullptr;
    this->segment = nullptr;
    this->Reset();
}